

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void __thiscall
UncompressedRow::assign(UncompressedRow *this,int index,const_iterator begin,const_iterator end)

{
  this->_M_index = index;
  this->_M_begin = begin;
  this->_M_end = end;
  this->_M_endNonZeros = end;
  for (; (begin != end && (*begin == 0)); begin = begin + 1) {
  }
  this->_M_beginNonZeros = begin;
  return;
}

Assistant:

inline void assign (int index, const_iterator begin, const_iterator end)
  {
    _M_index = index;
    _M_begin = begin;
    _M_end = end;

    _M_beginNonZeros = _M_begin;
    _M_endNonZeros = _M_end;

    for (_M_beginNonZeros = _M_begin; _M_beginNonZeros != _M_end && ! _M_beginNonZeros [0]; ++_M_beginNonZeros)
      /*continue*/ ;

#if 0
    for (_M_endNonZeros = _M_end; _M_endNonZeros != _M_beginNonZeros && ! _M_endNonZeros [-1]; --_M_endNonZeros)
      /*continue*/ ;
#endif
  }